

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O0

void __thiscall AllDiffBoundsImp<4>::sortit(AllDiffBoundsImp<4> *this)

{
  IntVar *pIVar1;
  int64_t iVar2;
  int iVar3;
  IntView<4> *in_RDI;
  int j_2;
  int t_1;
  int i_2;
  int j_1;
  int t;
  int i_1;
  int last;
  int max;
  int min;
  int j;
  int i;
  int local_34;
  int local_2c;
  int local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_20 = in_RDI[2].a;
  while (local_20 = local_20 + -1, -1 < local_20) {
    iVar3 = *(int *)(*(long *)&in_RDI[4].a + (long)local_20 * 4);
    iVar2 = IntView<4>::getMin(in_RDI);
    *(int *)((long)&(in_RDI[4].var)->super_Var + (long)iVar3 * 0x14 + 4) = (int)iVar2;
    local_28 = local_20;
    while ((local_28 < in_RDI[2].a + -1 &&
           (*(int *)((long)&(in_RDI[4].var)->super_Var +
                    (long)*(int *)(*(long *)&in_RDI[4].a + (long)(local_28 + 1) * 4) * 0x14 + 4) <=
            *(int *)((long)&(in_RDI[4].var)->super_Var + (long)iVar3 * 0x14 + 4)))) {
      *(undefined4 *)(*(long *)&in_RDI[4].a + (long)local_28 * 4) =
           *(undefined4 *)(*(long *)&in_RDI[4].a + (long)(local_28 + 1) * 4);
      local_28 = local_28 + 1;
    }
    *(int *)(*(long *)&in_RDI[4].a + (long)local_28 * 4) = iVar3;
  }
  local_2c = in_RDI[2].a;
  while (local_2c = local_2c + -1, -1 < local_2c) {
    iVar3 = *(int *)((long)&((in_RDI[5].var)->super_Var).super_Branching._vptr_Branching +
                    (long)local_2c * 4);
    iVar2 = IntView<4>::getMax(in_RDI);
    (&(in_RDI[4].var)->var_id)[(long)iVar3 * 5] = (int)iVar2 + 1;
    local_34 = local_2c;
    while ((local_34 < in_RDI[2].a + -1 &&
           ((&(in_RDI[4].var)->var_id)
            [(long)*(int *)((long)&((in_RDI[5].var)->super_Var).super_Branching._vptr_Branching +
                           (long)(local_34 + 1) * 4) * 5] <=
            (&(in_RDI[4].var)->var_id)[(long)iVar3 * 5]))) {
      *(undefined4 *)
       ((long)&((in_RDI[5].var)->super_Var).super_Branching._vptr_Branching + (long)local_34 * 4) =
           *(undefined4 *)
            ((long)&((in_RDI[5].var)->super_Var).super_Branching._vptr_Branching +
            (long)(local_34 + 1) * 4);
      local_34 = local_34 + 1;
    }
    *(int *)((long)&((in_RDI[5].var)->super_Var).super_Branching._vptr_Branching +
            (long)local_34 * 4) = iVar3;
  }
  local_14 = *(int *)((long)&(in_RDI[4].var)->super_Var + (long)**(int **)&in_RDI[4].a * 0x14 + 4);
  local_18 = (&(in_RDI[4].var)->var_id)
             [(long)*(int *)&((in_RDI[5].var)->super_Var).super_Branching._vptr_Branching * 5];
  local_1c = local_14 + -2;
  *(int *)&((in_RDI[6].var)->super_Var).super_Branching._vptr_Branching = local_1c;
  in_RDI[5].a = 0;
  local_10 = 0;
  local_c = 0;
  while( true ) {
    while ((local_c < in_RDI[2].a && (local_14 <= local_18))) {
      if (local_14 != local_1c) {
        local_1c = local_14;
        pIVar1 = in_RDI[6].var;
        iVar3 = in_RDI[5].a + 1;
        in_RDI[5].a = iVar3;
        *(int *)((long)&(pIVar1->super_Var).super_Branching._vptr_Branching + (long)iVar3 * 4) =
             local_14;
      }
      (&(in_RDI[4].var)->min)[(long)*(int *)(*(long *)&in_RDI[4].a + (long)local_c * 4) * 5].v =
           in_RDI[5].a;
      local_c = local_c + 1;
      if (local_c < in_RDI[2].a) {
        local_14 = *(int *)((long)&(in_RDI[4].var)->super_Var +
                           (long)*(int *)(*(long *)&in_RDI[4].a + (long)local_c * 4) * 0x14 + 4);
      }
    }
    if (local_18 != local_1c) {
      local_1c = local_18;
      pIVar1 = in_RDI[6].var;
      iVar3 = in_RDI[5].a + 1;
      in_RDI[5].a = iVar3;
      *(int *)((long)&(pIVar1->super_Var).super_Branching._vptr_Branching + (long)iVar3 * 4) =
           local_18;
    }
    (&(in_RDI[4].var)->max)
    [(long)*(int *)((long)&((in_RDI[5].var)->super_Var).super_Branching._vptr_Branching +
                   (long)local_10 * 4) * 5].v = in_RDI[5].a;
    local_10 = local_10 + 1;
    if (local_10 == in_RDI[2].a) break;
    local_18 = (&(in_RDI[4].var)->var_id)
               [(long)*(int *)((long)&((in_RDI[5].var)->super_Var).super_Branching._vptr_Branching +
                              (long)local_10 * 4) * 5];
  }
  *(int *)((long)&((in_RDI[6].var)->super_Var).super_Branching._vptr_Branching +
          (long)(in_RDI[5].a + 1) * 4) =
       *(int *)((long)&((in_RDI[6].var)->super_Var).super_Branching._vptr_Branching +
               (long)in_RDI[5].a * 4) + 2;
  return;
}

Assistant:

void sortit() {
		int i;
		int j;
		int min;
		int max;
		int last;

		for (int i = sz - 1; i >= 0; --i) {
			const int t = minsorted[i];
			iv[t].min = static_cast<int>(x[t].getMin());
			int j;
			for (j = i; j < sz - 1; ++j) {
				if (iv[t].min < iv[minsorted[j + 1]].min) {
					break;
				}
				minsorted[j] = minsorted[j + 1];
			}
			minsorted[j] = t;
		}
		for (int i = sz - 1; i >= 0; --i) {
			const int t = maxsorted[i];
			iv[t].max = static_cast<int>(x[t].getMax()) + 1;
			int j;
			for (j = i; j < sz - 1; ++j) {
				if (iv[t].max < iv[maxsorted[j + 1]].max) {
					break;
				}
				maxsorted[j] = maxsorted[j + 1];
			}
			maxsorted[j] = t;
		}

		min = iv[minsorted[0]].min;
		max = iv[maxsorted[0]].max;
		bounds[0] = last = min - 2;

		for (i = j = nb = 0;;) {       // merge minsorted[] and maxsorted[] into bounds[]
			if (i < sz && min <= max) {  // make sure minsorted exhausted first
				if (min != last) {
					bounds[++nb] = last = min;
				}
				iv[minsorted[i]].minrank = nb;
				if (++i < sz) {
					min = iv[minsorted[i]].min;
				}
			} else {
				if (max != last) {
					bounds[++nb] = last = max;
				}
				iv[maxsorted[j]].maxrank = nb;
				if (++j == sz) {
					break;
				}
				max = iv[maxsorted[j]].max;
			}
		}
		bounds[nb + 1] = bounds[nb] + 2;
	}